

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

int __thiscall
boost::deflate::inflate_stream_test::ZlibDecompressor::init
          (ZlibDecompressor *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  runtime_error *this_00;
  domain_error *this_01;
  char in_DL;
  int res;
  int local_14;
  wrap wrap_local;
  int windowBits_local;
  ZlibDecompressor *this_local;
  
  local_14 = (int)ctx;
  if (in_DL == '\0') {
    local_14 = -local_14;
  }
  else if (in_DL == '\x02') {
    local_14 = local_14 + 0x10;
  }
  inflateEnd(&this->zs);
  (this->zs).adler = 0;
  (this->zs).reserved = 0;
  (this->zs).opaque = (voidpf)0x0;
  *(undefined8 *)&(this->zs).data_type = 0;
  (this->zs).zalloc = (alloc_func)0x0;
  (this->zs).zfree = (free_func)0x0;
  (this->zs).msg = (char *)0x0;
  (this->zs).state = (internal_state *)0x0;
  *(undefined8 *)&(this->zs).avail_out = 0;
  (this->zs).total_out = 0;
  (this->zs).total_in = 0;
  (this->zs).next_out = (Bytef *)0x0;
  (this->zs).next_in = (Bytef *)0x0;
  *(undefined8 *)&(this->zs).avail_in = 0;
  iVar1 = inflateInit2_(&this->zs,local_14,"1.2.11",0x70);
  if (iVar1 != -4) {
    if (iVar1 != -2) {
      return iVar1;
    }
    this_01 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error(this_01,"zlib decompressor: bad arg");
    __cxa_throw(this_01,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"zlib decompressor: no memory");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void init(int windowBits, wrap wrap) override
        {
            if(wrap == boost::deflate::wrap::none)
                windowBits *= -1;
            else if(wrap == boost::deflate::wrap::gzip)
                windowBits += 16;
            inflateEnd(&zs);
            zs = {};
            const auto res = inflateInit2(&zs, windowBits);
            switch(res){
            case Z_OK:
               break;
            case Z_MEM_ERROR:
               throw std::runtime_error{"zlib decompressor: no memory"};
            case Z_STREAM_ERROR:
               throw std::domain_error{"zlib decompressor: bad arg"};
            }
        }